

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

ssize_t extract_pack_stream(archive_read *a,size_t minimum)

{
  long lVar1;
  size_t *psVar2;
  int64_t *piVar3;
  byte bVar4;
  uint32_t uVar5;
  _7zip *zip;
  unsigned_long uVar6;
  lzma_ret lVar7;
  int iVar8;
  Bool BVar9;
  uchar *puVar10;
  void *pvVar11;
  uint8_t *__src;
  ssize_t sVar12;
  size_t sVar13;
  ulong uVar14;
  size_t sVar15;
  size_t sVar16;
  char *pcVar17;
  uint uVar18;
  ulong uVar19;
  uint64_t uVar20;
  uint64_t uVar21;
  byte *pbVar22;
  byte *pbVar23;
  uint uVar24;
  uint uVar25;
  uchar *puVar26;
  size_t sVar27;
  byte *pbVar28;
  size_t sVar29;
  ulong uVar30;
  size_t sVar31;
  ulong in_R11;
  long lVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  ssize_t bytes_avail;
  uint local_e4;
  uint64_t local_b8;
  uchar *local_b0;
  uint64_t local_a8;
  ulong local_a0;
  size_t local_98;
  size_t local_90;
  bz_stream *local_88;
  CPpmd7z_RangeDec *local_80;
  lzma_stream *local_78;
  code *local_70;
  IByteIn *local_68;
  uchar *local_60;
  size_t local_58;
  z_streamp local_50;
  CPpmd7 *local_48;
  code *local_40;
  size_t local_38;
  
  zip = (_7zip *)a->format->data;
  if ((zip->codec == 0) && (zip->codec2 == 0xffffffffffffffff)) {
    pvVar11 = __archive_read_ahead(a,minimum + (minimum == 0),(ssize_t *)&local_a8);
    if (0 < (long)local_a8 && pvVar11 != (void *)0x0) {
      if ((long)zip->pack_stream_inbytes_remaining < (long)local_a8) {
        local_a8 = zip->pack_stream_inbytes_remaining;
      }
      zip->pack_stream_inbytes_remaining = zip->pack_stream_inbytes_remaining - local_a8;
      if ((long)zip->folder_outbytes_remaining < (long)local_a8) {
        local_a8 = zip->folder_outbytes_remaining;
      }
      zip->folder_outbytes_remaining = zip->folder_outbytes_remaining - local_a8;
      zip->uncompressed_buffer_bytes_remaining = local_a8;
      return 0;
    }
    pcVar17 = "Truncated 7-Zip file body";
    iVar8 = 0x54;
    goto LAB_0017cc92;
  }
  puVar10 = zip->uncompressed_buffer;
  local_58 = minimum;
  if (puVar10 == (uchar *)0x0) {
    sVar16 = 0x10000;
    if (0x10000 < minimum) {
      sVar16 = minimum + 0x3ff & 0xfffffffffffffc00;
    }
    zip->uncompressed_buffer_size = sVar16;
    puVar10 = (uchar *)malloc(sVar16);
    zip->uncompressed_buffer = puVar10;
    if (puVar10 == (uchar *)0x0) {
      pcVar17 = "No memory for 7-Zip decompression";
      iVar8 = 0xc;
      goto LAB_0017cc92;
    }
LAB_0017bfb6:
    zip->uncompressed_buffer_bytes_remaining = 0;
  }
  else {
    if ((minimum <= zip->uncompressed_buffer_size) &&
       (minimum <= zip->uncompressed_buffer_bytes_remaining)) goto LAB_0017bfb6;
    lVar32 = (long)zip->uncompressed_buffer_pointer - (long)puVar10;
    if (zip->uncompressed_buffer_pointer == (uchar *)0x0) {
      lVar32 = 0;
    }
    if (zip->uncompressed_buffer_size < minimum) {
      uVar19 = minimum + 0x3ff & 0xfffffffffffffc00;
      puVar10 = (uchar *)realloc(puVar10,uVar19);
      if (puVar10 == (uchar *)0x0) {
        archive_set_error(&a->archive,0xc,"No memory for 7-Zip decompression");
        return -0x1e;
      }
      zip->uncompressed_buffer = puVar10;
      zip->uncompressed_buffer_size = uVar19;
    }
    if (lVar32 != 0) {
      memmove(zip->uncompressed_buffer,zip->uncompressed_buffer + lVar32,
              zip->uncompressed_buffer_bytes_remaining);
    }
  }
  zip->uncompressed_buffer_pointer = (uchar *)0x0;
  local_68 = &zip->bytein;
  local_80 = &zip->range_dec;
  local_70 = Ppmd7z_RangeDec_Init;
  local_40 = Ppmd7_DecodeSymbol;
  local_48 = &zip->ppmd7_context;
  local_50 = &zip->stream;
  local_88 = &zip->bzstream;
  local_78 = &zip->lzstream;
  local_60 = zip->odd_bcj;
  do {
    __src = (uint8_t *)__archive_read_ahead(a,1,(ssize_t *)&local_a8);
    if ((long)local_a8 < 1) {
      iVar8 = 0x54;
      pcVar17 = "Truncated 7-Zip file body";
LAB_0017c179:
      archive_set_error(&a->archive,iVar8,pcVar17);
      iVar8 = 1;
    }
    else {
      local_38 = zip->uncompressed_buffer_size;
      local_90 = zip->uncompressed_buffer_bytes_remaining;
      puVar10 = zip->uncompressed_buffer + local_90;
      local_a0 = local_38 - local_90;
      uVar19 = zip->pack_stream_inbytes_remaining;
      uVar20 = local_a8;
      if (uVar19 <= local_a8) {
        uVar20 = uVar19;
      }
      local_e4 = 0;
      sVar29 = local_a0;
      sVar31 = local_a0;
      uVar21 = uVar20;
      local_b0 = puVar10;
      if ((zip->codec == 0x21) || (zip->codec2 != 0x3030103)) {
LAB_0017c27d:
        sVar13 = sVar29;
        puVar26 = local_b0;
        if (zip->codec2 == 0x303011b) {
          sVar13 = zip->tmp_stream_bytes_remaining;
          if (sVar13 != 0) {
            sVar12 = Bcj2_Decode(zip,local_b0,sVar29);
            if (sVar12 < 0) {
              bVar33 = false;
              archive_set_error(&a->archive,-1,"BCJ2 conversion Failed");
              in_R11 = 0xffffffe7;
            }
            else {
              zip->main_stream_bytes_remaining =
                   zip->main_stream_bytes_remaining + (zip->tmp_stream_bytes_remaining - sVar13);
              sVar13 = sVar29 - sVar12;
              if ((uVar19 == 0) || (sVar13 == 0)) {
                sVar31 = local_a0 - sVar13;
                if (uVar19 == 0) {
                  if (zip->tmp_stream_bytes_remaining != 0) {
                    local_e4 = 1;
                  }
                  uVar21 = 0;
                  bVar33 = false;
                  in_R11 = (ulong)local_e4;
                }
                else {
                  uVar21 = 0;
                  bVar33 = false;
                  in_R11 = (ulong)local_e4;
                }
              }
              else {
                in_R11 = in_R11 & 0xffffffff;
                local_b0 = local_b0 + sVar12;
                bVar33 = true;
                sVar29 = sVar13;
              }
            }
            if (!bVar33) goto LAB_0017c9b2;
          }
          sVar13 = zip->tmp_stream_buff_size;
          puVar26 = zip->tmp_stream_buff;
        }
        uVar6 = zip->codec;
        if ((long)uVar6 < 0x30401) {
          if (uVar6 == 0) {
            uVar30 = sVar13;
            if (uVar20 < sVar13) {
              uVar30 = uVar20;
            }
            memcpy(puVar26,__src,uVar30);
            sVar27 = uVar20 - uVar30;
            sVar13 = sVar13 - uVar30;
            if (uVar19 == 0) {
              local_e4 = 1;
            }
          }
          else {
            if ((uVar6 != 0x21) && (uVar6 != 0x30101)) {
LAB_0017c577:
              pcVar17 = "Decompression internal error";
              goto LAB_0017c650;
            }
            (zip->lzstream).next_in = __src;
            (zip->lzstream).avail_in = uVar20;
            (zip->lzstream).next_out = puVar26;
            (zip->lzstream).avail_out = sVar13;
            lVar7 = lzma_code(local_78,LZMA_RUN);
            if (lVar7 != LZMA_OK) {
              if (lVar7 != LZMA_STREAM_END) {
                pcVar17 = "Decompression failed(%d)";
LAB_0017c66a:
                archive_set_error(&a->archive,-1,pcVar17,(ulong)lVar7);
LAB_0017c673:
                in_R11 = 0xffffffe7;
                goto LAB_0017c9b2;
              }
              lzma_end(local_78);
              zip->lzstream_valid = 0;
              local_e4 = 1;
            }
            sVar27 = (zip->lzstream).avail_in;
            sVar13 = (zip->lzstream).avail_out;
          }
        }
        else if (uVar6 == 0x30401) {
          sVar27 = uVar20;
          if (((zip->ppmd7_valid == 0) || (iVar8 = zip->ppmd7_stat, iVar8 < 0)) || (sVar13 == 0)) {
            bVar33 = false;
            archive_set_error(&a->archive,-1,"Decompression internal error");
            in_R11 = 0xffffffe7;
          }
          else {
            (zip->ppstream).next_in = __src;
            (zip->ppstream).avail_in = uVar20;
            (zip->ppstream).next_out = puVar26;
            (zip->ppstream).avail_out = sVar13;
            if (iVar8 == 0) {
              (zip->bytein).a = a;
              (zip->bytein).Read = ppmd_read;
              (zip->range_dec).Stream = local_68;
              BVar9 = (*local_70)(local_80);
              if (BVar9 == 0) {
                zip->ppmd7_stat = -1;
                archive_set_error(&a->archive,-1,"Failed to initialize PPMd range decorder");
              }
              else {
                if ((zip->ppstream).overconsumed == 0) {
                  zip->ppmd7_stat = 1;
                  in_R11 = in_R11 & 0xffffffff;
                  goto LAB_0017c560;
                }
                zip->ppmd7_stat = -1;
              }
              bVar33 = false;
              in_R11 = 0xffffffe7;
            }
            else {
LAB_0017c560:
              if (uVar19 == 0) {
                local_b8 = zip->folder_outbytes_remaining;
              }
              else {
                local_b8 = 0;
              }
              do {
                iVar8 = (*local_40)(local_48,&local_80->p);
                if (iVar8 < 0) {
                  zip->ppmd7_stat = -1;
                  bVar33 = false;
                  archive_set_error(&a->archive,0x54,"Failed to decode PPMd");
                  in_R11 = 0xffffffe7;
                }
                else if ((zip->ppstream).overconsumed == 0) {
                  in_R11 = in_R11 & 0xffffffff;
                  puVar26 = (zip->ppstream).next_out;
                  (zip->ppstream).next_out = puVar26 + 1;
                  *puVar26 = (uchar)iVar8;
                  piVar3 = &(zip->ppstream).avail_out;
                  *piVar3 = *piVar3 + -1;
                  piVar3 = &(zip->ppstream).total_out;
                  *piVar3 = *piVar3 + 1;
                  bVar33 = local_b8 == 0;
                  local_b8 = local_b8 - 1;
                  if (bVar33) {
                    local_b8 = 0;
                  }
                  bVar33 = true;
                }
                else {
                  zip->ppmd7_stat = -1;
                  in_R11 = 0xffffffe7;
                  bVar33 = false;
                }
                if (!bVar33) {
                  bVar33 = false;
                  goto LAB_0017c61e;
                }
                sVar15 = (zip->ppstream).avail_out;
              } while ((sVar15 != 0) && ((zip->ppstream).avail_in != 0 || local_b8 != 0));
              bVar33 = true;
              sVar13 = sVar15;
              sVar27 = (zip->ppstream).avail_in;
            }
          }
LAB_0017c61e:
          if (!bVar33) goto LAB_0017c9b2;
        }
        else {
          if (uVar6 == 0x40108) {
            (zip->stream).next_in = __src;
            (zip->stream).avail_in = (uint)uVar20;
            (zip->stream).next_out = puVar26;
            (zip->stream).avail_out = (uint)sVar13;
            lVar7 = cm_zlib_inflate(local_50,0);
            if (lVar7 != LZMA_OK) {
              if (lVar7 != LZMA_STREAM_END) {
                pcVar17 = "File decompression failed (%d)";
                goto LAB_0017c66a;
              }
              local_e4 = 1;
            }
            sVar27 = (size_t)(zip->stream).avail_in;
            sVar13 = (size_t)(zip->stream).avail_out;
            goto LAB_0017c6ac;
          }
          if (uVar6 != 0x40202) goto LAB_0017c577;
          (zip->bzstream).next_in = (char *)__src;
          (zip->bzstream).avail_in = (uint)uVar20;
          (zip->bzstream).next_out = (char *)puVar26;
          (zip->bzstream).avail_out = (uint)sVar13;
          iVar8 = BZ2_bzDecompress(local_88);
          if (iVar8 != 0) {
            if (iVar8 == 4) {
              iVar8 = BZ2_bzDecompressEnd(local_88);
              if (iVar8 == 0) {
                zip->bzstream_valid = 0;
                local_e4 = 1;
                goto LAB_0017c699;
              }
              pcVar17 = "Failed to clean up decompressor";
            }
            else {
              pcVar17 = "bzip decompression failed";
            }
LAB_0017c650:
            archive_set_error(&a->archive,-1,pcVar17);
            goto LAB_0017c673;
          }
LAB_0017c699:
          sVar27 = (size_t)(zip->bzstream).avail_in;
          sVar13 = (size_t)(zip->bzstream).avail_out;
        }
LAB_0017c6ac:
        uVar30 = local_a0 - sVar13;
        sVar31 = uVar30;
        if ((zip->codec != 0x21) && (zip->codec2 == 0x3030103)) {
          if (uVar30 < 5) {
            sVar31 = 0;
          }
          else {
            sVar15 = zip->bcj_prevPosT;
            uVar14 = (ulong)zip->bcj_prevMask;
            uVar5 = zip->bcj_ip;
            pbVar28 = puVar10 + (uVar30 - 4);
            local_90 = ((local_90 + sVar13) - local_38) + 5;
            sVar31 = 0;
            do {
              pbVar23 = puVar10 + sVar31;
              bVar33 = pbVar23 < pbVar28;
              if ((bVar33) && (bVar33 = true, (*pbVar23 & 0xfe) != 0xe8)) {
                lVar32 = sVar31 + local_90;
                pbVar22 = pbVar23;
                do {
                  pbVar23 = pbVar28;
                  if (lVar32 == 0) break;
                  pbVar23 = pbVar22 + 1;
                  lVar32 = lVar32 + 1;
                  pbVar22 = pbVar23;
                } while ((*pbVar23 & 0xfe) != 0xe8);
                bVar33 = pbVar23 < pbVar28;
              }
              sVar31 = (long)pbVar23 - (long)puVar10;
              if (bVar33) {
                sVar15 = sVar31 - sVar15;
                if (sVar15 < 4) {
                  uVar24 = (int)uVar14 << ((char)sVar15 - 1U & 0x1f);
                  uVar25 = uVar24 & 7;
                  if (uVar25 == 0) goto LAB_0017c7e8;
                  bVar34 = (0xe8U >> uVar25 & 1) != 0;
                  bVar35 = (byte)(pbVar23[4 - (ulong)(byte)(&x86_Convert_kMaskToBitNumber)[uVar25]]
                                 + 1) < 2;
                  uVar24 = (uVar24 & 3) * 2 + 1;
                  if (!bVar35 && !bVar34) {
                    uVar24 = uVar25;
                  }
                  uVar14 = (ulong)uVar24;
                  if (bVar35 || bVar34) {
                    sVar15 = sVar31;
                  }
                  sVar31 = sVar31 + (bVar35 || bVar34);
                  if (bVar35 || bVar34) goto LAB_0017c8a7;
                }
                else {
LAB_0017c7e8:
                  uVar14 = 0;
                }
                sVar15 = sVar31;
                bVar4 = pbVar23[4];
                if ((bVar4 == 0xff) || (bVar4 == 0)) {
                  uVar24 = (uint)pbVar23[1] |
                           (uint)pbVar23[2] << 8 | (uint)pbVar23[3] << 0x10 | (uint)bVar4 << 0x18;
                  do {
                    uVar25 = uVar24 - (uVar5 + (int)sVar15);
                    if ((uint)uVar14 == 0) {
                      bVar34 = false;
                    }
                    else {
                      uVar18 = uVar25 >> ((&x86_Convert_kMaskToBitNumber)[uVar14] * -8 + 0x18U &
                                         0x1f);
                      if (((char)uVar18 == -1) || ((uVar18 & 0xff) == 0)) {
                        uVar24 = ~(-1 << ((&x86_Convert_kMaskToBitNumber)[uVar14] * -8 & 0x1fU) ^
                                  uVar25);
                        bVar34 = true;
                      }
                      else {
                        bVar34 = false;
                      }
                    }
                  } while (bVar34);
                  pbVar23[4] = (byte)((int)(uVar25 * 0x80) >> 0x1f);
                  pbVar23[3] = (byte)(uVar25 >> 0x10);
                  pbVar23[2] = (byte)(uVar25 >> 8);
                  pbVar23[1] = (byte)uVar25;
                  sVar31 = sVar15 + 5;
                }
                else {
                  uVar14 = (ulong)(((uint)uVar14 & 3) * 2 + 1);
                  sVar31 = sVar15 + 1;
                }
              }
LAB_0017c8a7:
            } while (bVar33);
            zip->bcj_prevPosT = sVar15;
            zip->bcj_prevMask = (uint32_t)uVar14;
            zip->bcj_ip = zip->bcj_ip + (int)sVar31;
            local_98 = sVar27;
          }
          sVar16 = uVar30 - sVar31;
          zip->odd_bcj_size = sVar16;
          if ((((sVar16 == 0) || (local_e4 != 0)) || (4 < sVar16)) || (uVar19 == 0)) {
            zip->odd_bcj_size = 0;
            sVar31 = uVar30;
          }
          else {
            local_98 = sVar27;
            memcpy(local_60,puVar10 + sVar31,sVar16);
            sVar27 = local_98;
          }
        }
        uVar21 = uVar20 - sVar27;
        if (zip->codec2 == 0x303011b) {
          uVar19 = zip->tmp_stream_buff_size - sVar13;
          if (zip->main_stream_bytes_remaining <= uVar19) {
            uVar19 = zip->main_stream_bytes_remaining;
          }
          zip->tmp_stream_bytes_avail = uVar19;
          zip->tmp_stream_bytes_remaining = uVar19;
          sVar12 = Bcj2_Decode(zip,local_b0,sVar29);
          if (sVar12 < 0) {
            archive_set_error(&a->archive,-1,"BCJ2 conversion Failed");
            in_R11 = 0xffffffe7;
            goto LAB_0017c9b2;
          }
          zip->main_stream_bytes_remaining =
               zip->main_stream_bytes_remaining +
               (zip->tmp_stream_bytes_remaining - zip->tmp_stream_bytes_avail);
          sVar31 = (local_a0 - sVar29) + sVar12;
        }
        in_R11 = (ulong)local_e4;
      }
      else {
        if ((local_a0 < 5 && uVar19 != 0) && (zip->odd_bcj_size != 0)) {
          local_e4 = 0;
          bVar33 = false;
          in_R11 = 0;
          sVar31 = 0;
          uVar21 = 0;
        }
        else {
          if (local_a0 != 0 && zip->odd_bcj_size != 0) {
            lVar32 = 0;
            do {
              puVar10[lVar32] = zip->odd_bcj[lVar32];
              lVar1 = lVar32 + 1;
              psVar2 = &zip->odd_bcj_size;
              *psVar2 = *psVar2 - 1;
              if (*psVar2 == 0) break;
              bVar33 = local_a0 - 1 != lVar32;
              lVar32 = lVar1;
            } while (bVar33);
            local_b0 = puVar10 + lVar1;
            sVar29 = local_a0 - lVar1;
          }
          if ((uVar19 == 0) || (sVar29 == 0)) {
            in_R11 = (ulong)(uVar19 == 0);
            sVar31 = local_a0 - sVar29;
            uVar21 = 0;
            bVar33 = false;
            local_e4 = (uint)(uVar19 == 0);
          }
          else {
            local_e4 = 0;
            bVar33 = true;
          }
        }
        if (bVar33) goto LAB_0017c27d;
      }
LAB_0017c9b2:
      iVar8 = 1;
      if ((uint)in_R11 < 2) {
        uVar20 = zip->pack_stream_inbytes_remaining;
        zip->pack_stream_inbytes_remaining = uVar20 - uVar21;
        uVar19 = zip->folder_outbytes_remaining;
        uVar30 = uVar19;
        if (sVar31 < uVar19) {
          uVar30 = sVar31;
        }
        zip->folder_outbytes_remaining = uVar19 - uVar30;
        sVar29 = zip->uncompressed_buffer_bytes_remaining + uVar30;
        zip->uncompressed_buffer_bytes_remaining = sVar29;
        zip->pack_stream_bytes_unconsumed = uVar21;
        iVar8 = 2;
        if ((sVar29 != zip->uncompressed_buffer_size) &&
           ((((iVar8 = 2, zip->codec2 != 0x3030103 || (sVar29 + 5 <= zip->uncompressed_buffer_size))
             || (zip->odd_bcj_size == 0)) && ((uVar20 != uVar21 || (sVar31 < uVar19)))))) {
          if (((uint)in_R11 != 0) || (uVar30 == 0 && uVar21 == 0)) {
            iVar8 = -1;
            pcVar17 = "Damaged 7-Zip archive";
            goto LAB_0017c179;
          }
          read_consume(a);
          iVar8 = 0;
        }
      }
    }
  } while (iVar8 == 0);
  if (iVar8 != 2) {
    return -0x1e;
  }
  if (local_58 <= zip->uncompressed_buffer_bytes_remaining) {
    zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
    return 0;
  }
  pcVar17 = "Damaged 7-Zip archive";
  iVar8 = -1;
LAB_0017cc92:
  archive_set_error(&a->archive,iVar8,pcVar17);
  return -0x1e;
}

Assistant:

static ssize_t
extract_pack_stream(struct archive_read *a, size_t minimum)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	ssize_t bytes_avail;
	int r;

	if (zip->codec == _7Z_COPY && zip->codec2 == (unsigned long)-1) {
		if (minimum == 0)
			minimum = 1;
		if (__archive_read_ahead(a, minimum, &bytes_avail) == NULL
		    || bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}
		if (bytes_avail > (ssize_t)zip->pack_stream_inbytes_remaining)
			bytes_avail = (ssize_t)zip->pack_stream_inbytes_remaining;
		zip->pack_stream_inbytes_remaining -= bytes_avail;
		if (bytes_avail > (ssize_t)zip->folder_outbytes_remaining)
			bytes_avail = (ssize_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_avail;
		zip->uncompressed_buffer_bytes_remaining = bytes_avail;
		return (ARCHIVE_OK);
	}

	/* If the buffer hasn't been allocated, allocate it now. */
	if (zip->uncompressed_buffer == NULL) {
		zip->uncompressed_buffer_size = UBUFF_SIZE;
		if (zip->uncompressed_buffer_size < minimum) {
			zip->uncompressed_buffer_size = minimum + 1023;
			zip->uncompressed_buffer_size &= ~0x3ff;
		}
		zip->uncompressed_buffer =
		    malloc(zip->uncompressed_buffer_size);
		if (zip->uncompressed_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for 7-Zip decompression");
			return (ARCHIVE_FATAL);
		}
		zip->uncompressed_buffer_bytes_remaining = 0;
	} else if (zip->uncompressed_buffer_size < minimum ||
	    zip->uncompressed_buffer_bytes_remaining < minimum) {
		/*
		 * Make sure the uncompressed buffer can have bytes
		 * at least `minimum' bytes.
		 * NOTE: This case happen when reading the header.
		 */
		size_t used;
		if (zip->uncompressed_buffer_pointer != 0)
			used = zip->uncompressed_buffer_pointer -
				zip->uncompressed_buffer;
		else
			used = 0;
		if (zip->uncompressed_buffer_size < minimum) {
			/*
			 * Expand the uncompressed buffer up to
			 * the minimum size.
			 */
			void *p;
			size_t new_size;

			new_size = minimum + 1023;
			new_size &= ~0x3ff;
			p = realloc(zip->uncompressed_buffer, new_size);
			if (p == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for 7-Zip decompression");
				return (ARCHIVE_FATAL);
			}
			zip->uncompressed_buffer = (unsigned char *)p;
			zip->uncompressed_buffer_size = new_size;
		}
		/*
		 * Move unconsumed bytes to the head.
		 */
		if (used) {
			memmove(zip->uncompressed_buffer,
				zip->uncompressed_buffer + used,
				zip->uncompressed_buffer_bytes_remaining);
		}
	} else
		zip->uncompressed_buffer_bytes_remaining = 0;
	zip->uncompressed_buffer_pointer = NULL;
	for (;;) {
		size_t bytes_in, bytes_out;
		const void *buff_in;
		unsigned char *buff_out;
		int end_of_data;

		/*
		 * Note: '1' here is a performance optimization.
		 * Recall that the decompression layer returns a count of
		 * available bytes; asking for more than that forces the
		 * decompressor to combine reads by copying data.
		 */
		buff_in = __archive_read_ahead(a, 1, &bytes_avail);
		if (bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}

		buff_out = zip->uncompressed_buffer
			+ zip->uncompressed_buffer_bytes_remaining;
		bytes_out = zip->uncompressed_buffer_size
			- zip->uncompressed_buffer_bytes_remaining;
		bytes_in = bytes_avail;
		if (bytes_in > zip->pack_stream_inbytes_remaining)
			bytes_in = (size_t)zip->pack_stream_inbytes_remaining;
		/* Drive decompression. */
		r = decompress(a, zip, buff_out, &bytes_out,
			buff_in, &bytes_in);
		switch (r) {
		case ARCHIVE_OK:
			end_of_data = 0;
			break;
		case ARCHIVE_EOF:
			end_of_data = 1;
			break;
		default:
			return (ARCHIVE_FATAL);
		}
		zip->pack_stream_inbytes_remaining -= bytes_in;
		if (bytes_out > zip->folder_outbytes_remaining)
			bytes_out = (size_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_out;
		zip->uncompressed_buffer_bytes_remaining += bytes_out;
		zip->pack_stream_bytes_unconsumed = bytes_in;

		/*
		 * Continue decompression until uncompressed_buffer is full.
		 */
		if (zip->uncompressed_buffer_bytes_remaining ==
		    zip->uncompressed_buffer_size)
			break;
		if (zip->codec2 == _7Z_X86 && zip->odd_bcj_size &&
		    zip->uncompressed_buffer_bytes_remaining + 5 >
		    zip->uncompressed_buffer_size)
			break;
		if (zip->pack_stream_inbytes_remaining == 0 &&
		    zip->folder_outbytes_remaining == 0)
			break;
		if (end_of_data || (bytes_in == 0 && bytes_out == 0)) {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
			return (ARCHIVE_FATAL);
		}
		read_consume(a);
	}
	if (zip->uncompressed_buffer_bytes_remaining < minimum) {
		archive_set_error(&(a->archive),
		    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
		return (ARCHIVE_FATAL);
	}
	zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
	return (ARCHIVE_OK);
}